

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

u16string * anon_unknown.dwarf_d849::cpputf8_u8_to_u16(u16string *__return_storage_ptr__,string *u8)

{
  const_iterator this;
  const_iterator start;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  in_RCX;
  string *u8_local;
  u16string *u16;
  
  std::__cxx11::u16string::u16string((u16string *)__return_storage_ptr__);
  this = std::begin<std::__cxx11::string>(u8);
  start = std::end<std::__cxx11::string>(u8);
  end._M_current = (char *)std::back_inserter<std::__cxx11::u16string>(__return_storage_ptr__);
  utf8::
  utf8to16<std::back_insert_iterator<std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((utf8 *)this._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )start._M_current,end,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

inline
u16string cpputf8_u8_to_u16(const string& u8)
{
    u16string u16;
    utf8::utf8to16(std::begin(u8), std::end(u8), std::back_inserter(u16));
    return u16;
}